

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form1_Sum(SumForm1 Sum)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  code *in_RDI;
  Image input;
  uint8_t intensity;
  undefined4 in_stack_ffffffffffffff74;
  undefined2 uVar5;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  Image *reference;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  Image local_60;
  ImageTemplate<unsigned_char> local_38;
  byte local_9;
  code *local_8;
  
  uVar5 = (undefined2)((uint)in_stack_ffffffffffffff74 >> 0x10);
  local_8 = in_RDI;
  local_9 = Unit_Test::intensityValue();
  reference = &local_60;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)(ulong)local_9,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,(uint8_t)((ushort)uVar5 >> 8),(uint8_t)uVar5);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,reference
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e467c);
  iVar1 = (*local_8)(&local_38);
  uVar2 = (uint)local_9;
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_38);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_38);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e46ee);
  return iVar1 == uVar2 * uVar3 * uVar4;
}

Assistant:

bool form1_Sum(SumForm1 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        return Sum( input ) == intensity * input.width() * input.height();
    }